

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O0

void spvtools::opt::anon_unknown_15::MakeSetClosedSSA
               (IRContext *context,Function *function,
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *blocks,unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                       *exit_bb,LCSSARewriter *lcssa_rewriter)

{
  __node_base_ptr def;
  bool bVar1;
  CFG *this;
  DominatorAnalysis *this_00;
  DominatorTree *dom_tree_00;
  DefUseManager *this_01;
  reference pvVar2;
  BasicBlock *bb_00;
  anon_class_32_4_4f2c5d0f local_150;
  function<void_(spvtools::opt::Instruction_*,_unsigned_int)> local_130;
  undefined1 local_110 [8];
  UseRewriter rewriter;
  Instruction *inst;
  iterator __end3;
  iterator __begin3;
  BasicBlock *__range3;
  BasicBlock *bb;
  _Node_iterator_base<unsigned_int,_false> _Stack_60;
  uint32_t bb_id;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2;
  DefUseManager *def_use_manager;
  DominatorTree *dom_tree;
  CFG *cfg;
  LCSSARewriter *lcssa_rewriter_local;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *exit_bb_local;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *blocks_local;
  Function *function_local;
  IRContext *context_local;
  
  this = IRContext::cfg(context);
  this_00 = IRContext::GetDominatorAnalysis(context,function);
  dom_tree_00 = DominatorAnalysisBase::GetDomTree(&this_00->super_DominatorAnalysisBase);
  this_01 = IRContext::get_def_use_mgr(context);
  __end2 = std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)blocks);
  _Stack_60._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)blocks);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                            &stack0xffffffffffffffa0), bVar1) {
    pvVar2 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*(&__end2);
    bb_00 = CFG::block(this,*pvVar2);
    bVar1 = DominatesAnExit(bb_00,exit_bb,dom_tree_00);
    if (bVar1) {
      BasicBlock::begin((BasicBlock *)&__end3);
      BasicBlock::end((BasicBlock *)&inst);
      while (bVar1 = utils::operator!=(&__end3.super_iterator,
                                       (iterator_template<spvtools::opt::Instruction> *)&inst),
            bVar1) {
        rewriter.rewritten_._M_h._M_single_bucket =
             (__node_base_ptr)
             utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*(&__end3.super_iterator);
        LCSSARewriter::UseRewriter::UseRewriter
                  ((UseRewriter *)local_110,lcssa_rewriter,
                   (Instruction *)rewriter.rewritten_._M_h._M_single_bucket);
        def = rewriter.rewritten_._M_h._M_single_bucket;
        local_150.rewriter = (UseRewriter *)local_110;
        local_150.blocks = blocks;
        local_150.exit_bb = exit_bb;
        local_150.context = context;
        std::function<void(spvtools::opt::Instruction*,unsigned_int)>::
        function<spvtools::opt::(anonymous_namespace)::MakeSetClosedSSA(spvtools::opt::IRContext*,spvtools::opt::Function*,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>const&,std::unordered_set<spvtools::opt::BasicBlock*,std::hash<spvtools::opt::BasicBlock*>,std::equal_to<spvtools::opt::BasicBlock*>,std::allocator<spvtools::opt::BasicBlock*>>const&,spvtools::opt::(anonymous_namespace)::LCSSARewriter*)::_lambda(spvtools::opt::Instruction*,unsigned_int)_1_,void>
                  ((function<void(spvtools::opt::Instruction*,unsigned_int)> *)&local_130,&local_150
                  );
        analysis::DefUseManager::ForEachUse(this_01,(Instruction *)def,&local_130);
        std::function<void_(spvtools::opt::Instruction_*,_unsigned_int)>::~function(&local_130);
        LCSSARewriter::UseRewriter::UpdateManagers((UseRewriter *)local_110);
        LCSSARewriter::UseRewriter::~UseRewriter((UseRewriter *)local_110);
        InstructionList::iterator::operator++(&__end3);
      }
    }
    std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  }
  return;
}

Assistant:

inline void MakeSetClosedSSA(IRContext* context, Function* function,
                             const std::unordered_set<uint32_t>& blocks,
                             const std::unordered_set<BasicBlock*>& exit_bb,
                             LCSSARewriter* lcssa_rewriter) {
  CFG& cfg = *context->cfg();
  DominatorTree& dom_tree =
      context->GetDominatorAnalysis(function)->GetDomTree();
  analysis::DefUseManager* def_use_manager = context->get_def_use_mgr();

  for (uint32_t bb_id : blocks) {
    BasicBlock* bb = cfg.block(bb_id);
    // If bb does not dominate an exit block, then it cannot have escaping defs.
    if (!DominatesAnExit(bb, exit_bb, dom_tree)) continue;
    for (Instruction& inst : *bb) {
      LCSSARewriter::UseRewriter rewriter(lcssa_rewriter, inst);
      def_use_manager->ForEachUse(
          &inst, [&blocks, &rewriter, &exit_bb, context](
                     Instruction* use, uint32_t operand_index) {
            BasicBlock* use_parent = context->get_instr_block(use);
            assert(use_parent);
            if (blocks.count(use_parent->id())) return;

            if (use->opcode() == spv::Op::OpPhi) {
              // If the use is a Phi instruction and the incoming block is
              // coming from the loop, then that's consistent with LCSSA form.
              if (exit_bb.count(use_parent)) {
                return;
              } else {
                // That's not an exit block, but the user is a phi instruction.
                // Consider the incoming branch only.
                use_parent = context->get_instr_block(
                    use->GetSingleWordOperand(operand_index + 1));
              }
            }
            // Rewrite the use. Note that this call does not invalidate the
            // def/use manager. So this operation is safe.
            rewriter.RewriteUse(use_parent, use, operand_index);
          });
      rewriter.UpdateManagers();
    }
  }
}